

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScene::keyPressEvent(QGraphicsScene *this,QKeyEvent *keyEvent)

{
  QGraphicsScenePrivate *this_00;
  long lVar1;
  bool bVar2;
  QGraphicsItem *this_01;
  QGraphicsScenePrivate *d;
  QGraphicsItem *p;
  
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  lVar1 = (this_00->keyboardGrabberItems).d.size;
  if (lVar1 == 0) {
    this_01 = (QGraphicsItem *)0x0;
  }
  else {
    this_01 = (this_00->keyboardGrabberItems).d.ptr[lVar1 + -1];
  }
  if (this_01 == (QGraphicsItem *)0x0) {
    this_01 = (&this_00->focusItem)[(ulong)(this_00->activationRefCount < 1) * 2];
  }
  if (this_01 == (QGraphicsItem *)0x0) {
    keyEvent[0xc] = (QKeyEvent)0x0;
  }
  else {
    while( true ) {
      keyEvent[0xc] = (QKeyEvent)0x1;
      bVar2 = QGraphicsItem::isBlockedByModalPanel(this_01,(QGraphicsItem **)0x0);
      if (((bVar2) ||
          (bVar2 = QGraphicsScenePrivate::sendEvent(this_00,this_01,(QEvent *)keyEvent), !bVar2)) ||
         (keyEvent[0xc] != (QKeyEvent)0x0)) break;
      bVar2 = QGraphicsItem::isPanel(this_01);
      if (bVar2) {
        return;
      }
      this_01 = QGraphicsItem::parentItem(this_01);
      if (this_01 == (QGraphicsItem *)0x0) {
        return;
      }
    }
  }
  return;
}

Assistant:

void QGraphicsScene::keyPressEvent(QKeyEvent *keyEvent)
{
    // ### Merge this function with keyReleaseEvent; they are identical
    // ### (except this comment).
    Q_D(QGraphicsScene);
    QGraphicsItem *item = !d->keyboardGrabberItems.isEmpty() ? d->keyboardGrabberItems.constLast() : 0;
    if (!item)
        item = focusItem();
    if (item) {
        QGraphicsItem *p = item;
        do {
            // Accept the event by default
            keyEvent->accept();
            // Send it; QGraphicsItem::keyPressEvent ignores it.  If the event
            // is filtered out, stop propagating it.
            if (p->isBlockedByModalPanel())
                break;
            if (!d->sendEvent(p, keyEvent))
                break;
        } while (!keyEvent->isAccepted() && !p->isPanel() && (p = p->parentItem()));
    } else {
        keyEvent->ignore();
    }
}